

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_promise_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  void *pvVar2;
  JSPromiseReactionData *pJVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSPromiseReactionData *rd;
  bool bVar6;
  long lVar7;
  bool bVar8;
  JSValue v;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x2a)) &&
     (pvVar2 = *(void **)((long)val.u.ptr + 0x30), pvVar2 != (void *)0x0)) {
    lVar7 = 0;
    bVar6 = true;
    do {
      bVar8 = bVar6;
      rd = *(JSPromiseReactionData **)((long)pvVar2 + lVar7 * 0x10 + 0x10);
      while (rd != (JSPromiseReactionData *)((long)pvVar2 + lVar7 * 0x10 + 8)) {
        pJVar3 = (JSPromiseReactionData *)(rd->link).next;
        promise_reaction_data_free(rt,rd);
        rd = pJVar3;
      }
      lVar7 = 1;
      bVar6 = false;
    } while (bVar8);
    iVar4 = *(int64_t *)((long)pvVar2 + 0x38);
    if (0xfffffff4 < (uint)iVar4) {
      JVar5 = (JSValueUnion)((JSValueUnion *)((long)pvVar2 + 0x30))->ptr;
      iVar1 = *JVar5.ptr;
      *(int *)JVar5.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = iVar4;
        v.u.ptr = JVar5.ptr;
        __JS_FreeValueRT(rt,v);
      }
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pvVar2);
    return;
  }
  return;
}

Assistant:

static void js_promise_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each_safe(el, el1, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            promise_reaction_data_free(rt, rd);
        }
    }
    JS_FreeValueRT(rt, s->promise_result);
    js_free_rt(rt, s);
}